

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorBasicData.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorBasicData::Decode
          (Mode5InterrogatorBasicData *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xf < KVar1) {
    (*(this->m_Status).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Status,stream);
    KDataStream::Read(stream,&this->m_ui8Padding);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32MsgFormats);
    (*(this->m_InterrogatedID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_InterrogatedID,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding2);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Mode5InterrogatorBasicData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < MODE_5_INTERROGATOR_BASIC_DATA_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );
	
    stream >> KDIS_STREAM m_Status
		   >> m_ui8Padding
		   >> m_ui16Padding1
		   >> m_ui32MsgFormats
		   >> KDIS_STREAM m_InterrogatedID
		   >> m_ui16Padding2;	
}